

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

int slow_memcmp(void *_a,void *_b,size_t n)

{
  byte bVar1;
  byte bVar2;
  uint8_t bc;
  uint8_t ac;
  uint8_t *b;
  uint8_t *a;
  size_t n_local;
  void *_b_local;
  void *_a_local;
  int local_4;
  
  b = (uint8_t *)_b;
  a = (uint8_t *)_a;
  n_local = n;
  do {
    if (n_local == 0) {
      return 0;
    }
    bVar1 = *a;
    bVar2 = *b;
    b = b + 1;
    a = a + 1;
    n_local = n_local - 1;
  } while (bVar1 == bVar2);
  if (bVar1 < bVar2) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

ATTRIBUTE_UNUSED
static int slow_memcmp(const void *_a, const void *_b, size_t n) {
  const uint8_t *a = reinterpret_cast<const uint8_t *>(_a);
  const uint8_t *b = reinterpret_cast<const uint8_t *>(_b);
  while (n-- != 0) {
    uint8_t ac = *a++;
    uint8_t bc = *b++;
    if (ac != bc) {
      if (ac < bc) {
        return -1;
      }
      return 1;
    }
  }
  return 0;
}